

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::scan_id(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  size_t pos;
  
  pos = this->m_pos;
  while (pos < (this->m_in).size_) {
    pbVar4 = (byte *)nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                               (&this->m_in,pos);
    bVar1 = *pbVar4;
    iVar2 = isalnum((int)(char)bVar1);
    if ((iVar2 == 0) &&
       ((uVar3 = bVar1 - 0x2d, 0x32 < uVar3 ||
        ((0x4000000000007U >> ((ulong)uVar3 & 0x3f) & 1) == 0)))) break;
    pos = this->m_pos + 1;
    this->m_pos = pos;
  }
  make_token(__return_storage_ptr__,this,Id);
  return __return_storage_ptr__;
}

Assistant:

Token scan_id() {
		for (;;) {
			if (m_pos >= m_in.size()) {
				break;
			}
			char ch = m_in[m_pos];
			if (!std::isalnum(ch) && ch != '.' && ch != '/' && ch != '_' && ch != '-') {
				break;
			}
			m_pos += 1;
		}
		return make_token(Token::Kind::Id);
	}